

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall Catch::anon_unknown_26::ANSIColourImpl::use(ANSIColourImpl *this,Code _colourCode)

{
  int iVar1;
  undefined4 extraout_var;
  ReusableStringStream *pRVar2;
  SourceLineInfo local_b0;
  ReusableStringStream local_a0;
  string local_90;
  SourceLineInfo local_60;
  ReusableStringStream local_50;
  string local_40;
  anon_class_8_1_ba1d6aae local_20;
  anon_class_8_1_ba1d6aae setColour;
  Code _colourCode_local;
  ANSIColourImpl *this_local;
  
  setColour.out._4_4_ = _colourCode;
  iVar1 = (*((this->super_ColourImpl).m_stream)->_vptr_IStream[2])();
  local_20.out = (ostream *)CONCAT44(extraout_var,iVar1);
  switch(setColour.out._4_4_) {
  case None:
  case Headers:
    use::anon_class_8_1_ba1d6aae::operator()(&local_20,"[0m");
    break;
  case Red:
    use::anon_class_8_1_ba1d6aae::operator()(&local_20,"[0;31m");
    break;
  case Green:
    use::anon_class_8_1_ba1d6aae::operator()(&local_20,"[0;32m");
    break;
  case Blue:
    use::anon_class_8_1_ba1d6aae::operator()(&local_20,"[0;34m");
    break;
  case Cyan:
    use::anon_class_8_1_ba1d6aae::operator()(&local_20,"[0;36m");
    break;
  case Yellow:
    use::anon_class_8_1_ba1d6aae::operator()(&local_20,"[0;33m");
    break;
  case Grey:
    use::anon_class_8_1_ba1d6aae::operator()(&local_20,"[1;30m");
    break;
  default:
    ReusableStringStream::ReusableStringStream(&local_a0);
    SourceLineInfo::SourceLineInfo
              (&local_b0,
               "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/catch_amalgamated.cpp"
               ,0xd3e);
    pRVar2 = ReusableStringStream::operator<<(&local_a0,&local_b0);
    pRVar2 = ReusableStringStream::operator<<(pRVar2,(char (*) [26])": Internal Catch2 error: ");
    pRVar2 = ReusableStringStream::operator<<(pRVar2,(char (*) [25])"Unknown colour requested");
    ReusableStringStream::str_abi_cxx11_(&local_90,pRVar2);
    throw_logic_error(&local_90);
  case Bright:
    ReusableStringStream::ReusableStringStream(&local_50);
    SourceLineInfo::SourceLineInfo
              (&local_60,
               "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/catch_amalgamated.cpp"
               ,0xd3d);
    pRVar2 = ReusableStringStream::operator<<(&local_50,&local_60);
    pRVar2 = ReusableStringStream::operator<<(pRVar2,(char (*) [26])": Internal Catch2 error: ");
    pRVar2 = ReusableStringStream::operator<<(pRVar2,(char (*) [13])"not a colour");
    ReusableStringStream::str_abi_cxx11_(&local_40,pRVar2);
    throw_logic_error(&local_40);
  case BrightWhite:
    use::anon_class_8_1_ba1d6aae::operator()(&local_20,"[1;37m");
    break;
  case BrightRed:
    use::anon_class_8_1_ba1d6aae::operator()(&local_20,"[1;31m");
    break;
  case BrightGreen:
    use::anon_class_8_1_ba1d6aae::operator()(&local_20,"[1;32m");
    break;
  case BrightYellow:
    use::anon_class_8_1_ba1d6aae::operator()(&local_20,"[1;33m");
    break;
  case FileName:
    use::anon_class_8_1_ba1d6aae::operator()(&local_20,"[0;37m");
  }
  return;
}

Assistant:

void use( Colour::Code _colourCode ) const override {
            auto setColour = [&out =
                                  m_stream->stream()]( char const* escapeCode ) {
                // The escape sequence must be flushed to console, otherwise
                // if stdin and stderr are intermixed, we'd get accidentally
                // coloured output.
                out << '\033' << escapeCode << std::flush;
            };
            switch( _colourCode ) {
                case Colour::None:
                case Colour::White:     return setColour( "[0m" );
                case Colour::Red:       return setColour( "[0;31m" );
                case Colour::Green:     return setColour( "[0;32m" );
                case Colour::Blue:      return setColour( "[0;34m" );
                case Colour::Cyan:      return setColour( "[0;36m" );
                case Colour::Yellow:    return setColour( "[0;33m" );
                case Colour::Grey:      return setColour( "[1;30m" );

                case Colour::LightGrey:     return setColour( "[0;37m" );
                case Colour::BrightRed:     return setColour( "[1;31m" );
                case Colour::BrightGreen:   return setColour( "[1;32m" );
                case Colour::BrightWhite:   return setColour( "[1;37m" );
                case Colour::BrightYellow:  return setColour( "[1;33m" );

                case Colour::Bright: CATCH_INTERNAL_ERROR( "not a colour" );
                default: CATCH_INTERNAL_ERROR( "Unknown colour requested" );
            }
        }